

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkPredict_Bootstrap
              (ARKodeMem ark_mem,sunrealtype hj,sunrealtype tau,int nvec,sunrealtype *cvals,
              N_Vector *Xvecs,N_Vector yguess)

{
  int iVar1;
  ulong uVar2;
  char *msgfmt;
  double dVar3;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "ARKodeMem structure is NULL";
    ark_mem = (ARKodeMem)0x0;
    iVar1 = 0xc57;
  }
  else {
    if (ark_mem->interp != (ARKInterp)0x0) {
      dVar3 = (tau * tau * 0.5) / hj;
      if (0 < nvec) {
        uVar2 = 0;
        do {
          cvals[uVar2 + 2] = cvals[uVar2] * dVar3;
          Xvecs[uVar2 + 2] = Xvecs[uVar2];
          uVar2 = uVar2 + 1;
        } while ((uint)nvec != uVar2);
      }
      *cvals = 1.0;
      *Xvecs = ark_mem->yn;
      cvals[1] = tau - dVar3;
      Xvecs[1] = ark_mem->fn;
      iVar1 = N_VLinearCombination(nvec + 2,cvals,Xvecs,yguess);
      if (iVar1 != 0) {
        return -0x1c;
      }
      return 0;
    }
    msgfmt = "ARKodeInterpMem structure is NULL";
    iVar1 = 0xc5d;
  }
  arkProcessError(ark_mem,-0x15,iVar1,"arkPredict_Bootstrap",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return -0x15;
}

Assistant:

int arkPredict_Bootstrap(ARKodeMem ark_mem, sunrealtype hj, sunrealtype tau,
                         int nvec, sunrealtype* cvals, N_Vector* Xvecs,
                         N_Vector yguess)
{
  sunrealtype a0, a1, a2;
  int i, retval;

  /* verify that ark_mem and interpolation structure are provided */
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeMem structure is NULL");
    return (ARK_MEM_NULL);
  }
  if (ark_mem->interp == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "ARKodeInterpMem structure is NULL");
    return (ARK_MEM_NULL);
  }

  /* set coefficients for Hermite interpolant */
  a0 = ONE;
  a2 = tau * tau / TWO / hj;
  a1 = tau - a2;

  /* set arrays for fused vector operation; shift inputs for
     f(t_n+hj,z_j) to end of queue */
  for (i = 0; i < nvec; i++)
  {
    cvals[2 + i] = a2 * cvals[i];
    Xvecs[2 + i] = Xvecs[i];
  }
  cvals[0] = a0;
  Xvecs[0] = ark_mem->yn;
  cvals[1] = a1;
  Xvecs[1] = ark_mem->fn;

  /* call fused vector operation to compute prediction */
  retval = N_VLinearCombination(nvec + 2, cvals, Xvecs, yguess);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }
  return (ARK_SUCCESS);
}